

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall
cmCTestLaunchReporter::DumpFileToXML
          (cmCTestLaunchReporter *this,cmXMLElement *e3,char *tag,string *fname)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  cmAlphaNum local_370;
  cmAlphaNum local_340;
  string local_310;
  cmAlphaNum local_2f0;
  cmAlphaNum local_2c0;
  string local_290;
  cmXMLElement local_260;
  cmXMLElement e4;
  char *sep;
  string line;
  ifstream fin;
  string *fname_local;
  char *tag_local;
  cmXMLElement *e3_local;
  cmCTestLaunchReporter *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar3,_Var2);
  std::__cxx11::string::string((string *)&sep);
  e4.xmlwr = (cmXMLWriter *)0xd97e77;
  cmXMLElement::cmXMLElement(&local_260,e3,tag);
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)(line.field_2._M_local_buf + 8),(string *)&sep,(bool *)0x0,
                            0xffffffffffffffff), bVar1) {
    bVar1 = MatchesFilterPrefix(this,(string *)&sep);
    if (!bVar1) {
      bVar1 = Match(this,(string *)&sep,&this->RegexWarningSuppress);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_2c0,"[CTest: warning suppressed] ");
        cmAlphaNum::cmAlphaNum(&local_2f0,(string *)&sep);
        cmStrCat<>(&local_290,&local_2c0,&local_2f0);
        std::__cxx11::string::operator=((string *)&sep,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
      }
      else {
        bVar1 = Match(this,(string *)&sep,&this->RegexWarning);
        if (bVar1) {
          cmAlphaNum::cmAlphaNum(&local_340,"[CTest: warning matched] ");
          cmAlphaNum::cmAlphaNum(&local_370,(string *)&sep);
          cmStrCat<>(&local_310,&local_340,&local_370);
          std::__cxx11::string::operator=((string *)&sep,(string *)&local_310);
          std::__cxx11::string::~string((string *)&local_310);
        }
      }
      cmXMLElement::Content<char_const*>(&local_260,(char **)&e4);
      cmXMLElement::Content<std::__cxx11::string>
                (&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep);
      e4.xmlwr = (cmXMLWriter *)0xd5f811;
    }
  }
  cmXMLElement::~cmXMLElement(&local_260);
  std::__cxx11::string::~string((string *)&sep);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

void cmCTestLaunchReporter::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                          std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (this->MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = cmStrCat("[CTest: warning suppressed] ", line);
    } else if (this->Match(line, this->RegexWarning)) {
      line = cmStrCat("[CTest: warning matched] ", line);
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}